

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_huffman_codes.cpp
# Opt level: O1

bool lzham::generate_huffman_codes
               (void *pContext,uint num_syms,uint16 *pFreq,uint8 *pCodesizes,uint *max_code_size,
               uint *total_freq_ret,code_size_histogram *code_size_hist)

{
  int iVar1;
  int *piVar2;
  ushort uVar3;
  uint uVar4;
  ulong uVar5;
  uint *puVar6;
  int iVar7;
  long lVar8;
  uint *puVar9;
  uint uVar10;
  uint uVar11;
  ulong uVar12;
  uint uVar13;
  ulong uVar14;
  uint *puVar15;
  int iVar16;
  long lVar17;
  uint uVar18;
  ulong uVar19;
  bool bVar20;
  int x [1024];
  uint auStack_1438 [254];
  uint auStack_1040 [258];
  uint local_c38 [770];
  
  if (num_syms - 1 < 0x400) {
    if (num_syms == 0) {
      uVar19 = 0;
      uVar10 = 0;
    }
    else {
      uVar14 = 0;
      uVar10 = 0;
      uVar19 = 0;
      do {
        uVar3 = pFreq[uVar14];
        if (uVar3 == 0) {
          pCodesizes[uVar14] = '\0';
        }
        else {
          uVar10 = uVar10 + uVar3;
          *(short *)((long)pContext + uVar19 * 8 + 4) = (short)uVar14;
          *(undefined2 *)((long)pContext + uVar19 * 8 + 6) = 0xffff;
          *(uint *)((long)pContext + uVar19 * 8) = (uint)uVar3;
          uVar19 = (ulong)((int)uVar19 + 1);
        }
        uVar14 = uVar14 + 1;
      } while (num_syms != uVar14);
    }
    *total_freq_ret = uVar10;
    uVar18 = (uint)uVar19;
    if (uVar18 == 1) {
      pCodesizes[*(ushort *)((long)pContext + 4)] = '\x01';
    }
    else {
      memset(auStack_1040 + 2,0,0x800);
      puVar9 = (uint *)pContext;
      if ((uVar19 & 0xfffffffe) != 0) {
        do {
          uVar11 = *puVar9;
          uVar13 = puVar9[2];
          auStack_1040[(ulong)(uVar11 & 0xff) + 2] = auStack_1040[(ulong)(uVar11 & 0xff) + 2] + 1;
          piVar2 = (int *)((long)local_c38 + (ulong)(uVar11 >> 6 & 0x3fc));
          *piVar2 = *piVar2 + 1;
          auStack_1040[(ulong)(uVar13 & 0xff) + 2] = auStack_1040[(ulong)(uVar13 & 0xff) + 2] + 1;
          piVar2 = (int *)((long)local_c38 + (ulong)(uVar13 >> 6 & 0x3fc));
          *piVar2 = *piVar2 + 1;
          puVar9 = puVar9 + 4;
        } while (puVar9 != (uint *)((long)pContext + (ulong)(uVar18 & 0xfffffffe) * 8));
      }
      if ((uVar19 & 1) != 0) {
        uVar11 = *puVar9;
        auStack_1040[(ulong)(uVar11 & 0xff) + 2] = auStack_1040[(ulong)(uVar11 & 0xff) + 2] + 1;
        piVar2 = (int *)((long)local_c38 + (ulong)(uVar11 >> 6 & 0x3fc));
        *piVar2 = *piVar2 + 1;
      }
      puVar9 = auStack_1040 + 3;
      puVar6 = (uint *)((long)pContext + 0x4008);
      lVar17 = 0;
      do {
        puVar15 = puVar6;
        uVar14 = 0xfffffffffffffffe;
        uVar11 = 0;
        do {
          auStack_1438[uVar14 + 2] = uVar11;
          uVar13 = puVar9[uVar14 + 1];
          auStack_1438[uVar14 + 3] = uVar11 + uVar13;
          uVar11 = uVar11 + uVar13 + puVar9[uVar14 + 2];
          uVar14 = uVar14 + 2;
          uVar12 = (ulong)(uVar18 & 0xfffffffe) << 3;
          puVar6 = (uint *)pContext;
          uVar5 = uVar19 & 0xfffffffe;
        } while (uVar14 < 0xfe);
        while (uVar5 != 0) {
          uVar11 = puVar6[2] >> 8;
          uVar13 = *puVar6 >> 8;
          if (lVar17 == 0) {
            uVar11 = puVar6[2];
            uVar13 = *puVar6;
          }
          uVar13 = uVar13 & 0xff;
          uVar11 = uVar11 & 0xff;
          uVar4 = auStack_1438[uVar13];
          if (uVar13 == uVar11) {
            auStack_1438[uVar13] = uVar4 + 2;
            *(undefined8 *)(puVar15 + (ulong)uVar4 * 2) = *(undefined8 *)puVar6;
            uVar13 = uVar4 + 1;
          }
          else {
            auStack_1438[uVar13] = uVar4 + 1;
            uVar13 = auStack_1438[uVar11];
            auStack_1438[uVar11] = uVar13 + 1;
            *(undefined8 *)(puVar15 + (ulong)uVar4 * 2) = *(undefined8 *)puVar6;
          }
          *(undefined8 *)(puVar15 + (ulong)uVar13 * 2) = *(undefined8 *)(puVar6 + 2);
          uVar12 = uVar12 - 0x10;
          puVar6 = puVar6 + 4;
          uVar5 = uVar12;
        }
        if ((uVar19 & 1) != 0) {
          uVar13 = *puVar6 >> ((char)lVar17 * '\b' & 0x1fU) & 0xff;
          uVar11 = auStack_1438[uVar13];
          auStack_1438[uVar13] = uVar11 + 1;
          *(undefined8 *)(puVar15 + (ulong)uVar11 * 2) = *(undefined8 *)puVar6;
        }
        if (local_c38[0] == uVar18) break;
        puVar9 = puVar9 + 0x100;
        bVar20 = lVar17 == 0;
        puVar6 = (uint *)pContext;
        lVar17 = lVar17 + 1;
        pContext = puVar15;
      } while (bVar20);
      if (uVar18 == 0) {
        uVar18 = 0;
      }
      else {
        uVar14 = 0;
        do {
          auStack_1040[uVar14 + 2] = puVar15[uVar14 * 2];
          uVar14 = uVar14 + 1;
        } while (uVar19 != uVar14);
        auStack_1040[2] = auStack_1040[2] + auStack_1040[3];
        uVar11 = uVar18 - 1;
        if (2 < (int)uVar18) {
          iVar16 = 0;
          iVar7 = 2;
          uVar14 = 1;
          do {
            if ((iVar7 < (int)uVar18) &&
               (lVar17 = (long)iVar7,
               (int)auStack_1040[lVar17 + 2] <= (int)auStack_1040[(long)iVar16 + 2])) {
              iVar7 = iVar7 + 1;
              auStack_1040[uVar14 + 2] = auStack_1040[lVar17 + 2];
            }
            else {
              auStack_1040[uVar14 + 2] = auStack_1040[(long)iVar16 + 2];
              auStack_1040[(long)iVar16 + 2] = (uint)uVar14;
              iVar16 = iVar16 + 1;
            }
            lVar17 = (long)iVar16;
            if ((iVar7 < (int)uVar18) &&
               (((long)uVar14 <= lVar17 ||
                ((int)auStack_1040[(long)iVar7 + 2] <= (int)auStack_1040[lVar17 + 2])))) {
              auStack_1040[uVar14 + 2] = auStack_1040[uVar14 + 2] + auStack_1040[(long)iVar7 + 2];
              iVar7 = iVar7 + 1;
            }
            else {
              auStack_1040[uVar14 + 2] = auStack_1040[uVar14 + 2] + auStack_1040[lVar17 + 2];
              iVar16 = iVar16 + 1;
              auStack_1040[lVar17 + 2] = (uint)uVar14;
            }
            uVar14 = uVar14 + 1;
          } while (uVar11 != uVar14);
        }
        auStack_1040[(int)uVar18] = 0;
        if (2 < (int)uVar18) {
          lVar17 = (ulong)(uVar18 - 3) + 1;
          do {
            auStack_1040[lVar17 + 1] = auStack_1040[(long)(int)auStack_1040[lVar17 + 1] + 2] + 1;
            lVar8 = lVar17 + -1;
            bVar20 = 0 < lVar17;
            lVar17 = lVar8;
          } while (lVar8 != 0 && bVar20);
        }
        uVar18 = uVar18 - 2;
        iVar16 = 1;
        uVar13 = 0;
        do {
          if ((int)uVar18 < 0) {
            iVar7 = 0;
          }
          else {
            iVar1 = uVar18 + 1;
            iVar7 = 0;
            do {
              if (auStack_1040[(ulong)uVar18 + 2] != uVar13) goto LAB_00104d12;
              iVar7 = iVar7 + 1;
              uVar18 = uVar18 - 1;
            } while (iVar1 != iVar7);
            uVar18 = 0xffffffff;
            iVar7 = iVar1;
          }
LAB_00104d12:
          if (iVar7 < iVar16) {
            puVar9 = auStack_1040 + (long)(int)uVar11 + 2;
            uVar11 = (uVar11 + iVar7) - iVar16;
            do {
              *puVar9 = uVar13;
              iVar16 = iVar16 + -1;
              puVar9 = puVar9 + -1;
            } while (iVar7 < iVar16);
          }
          iVar16 = iVar7 * 2;
          uVar13 = uVar13 + 1;
        } while (iVar7 != 0);
        uVar14 = 0;
        uVar18 = 0;
        do {
          uVar11 = auStack_1040[uVar14 + 2];
          if (uVar18 < uVar11) {
            uVar18 = uVar11;
          }
          uVar12 = 0x20;
          if (uVar11 < 0x20) {
            uVar12 = (ulong)uVar11;
          }
          code_size_hist->m_num_codes[uVar12] = code_size_hist->m_num_codes[uVar12] + 1;
          pCodesizes[(ushort)puVar15[uVar14 * 2 + 1]] = (uint8)uVar11;
          uVar14 = uVar14 + 1;
        } while (uVar19 != uVar14);
      }
      *max_code_size = uVar18;
    }
  }
  return num_syms - 1 < 0x400;
}

Assistant:

bool generate_huffman_codes(void* pContext, uint num_syms, const uint16* pFreq, uint8* pCodesizes, uint& max_code_size, uint& total_freq_ret, code_size_histogram &code_size_hist)
   {
      if ((!num_syms) || (num_syms > cHuffmanMaxSupportedSyms))
         return false;
                  
      huffman_work_tables& state = *static_cast<huffman_work_tables*>(pContext);;
            
      uint max_freq = 0;
      uint total_freq = 0;
      
      uint num_used_syms = 0;
      for (uint i = 0; i < num_syms; i++)
      {
         uint freq = pFreq[i];
         
         if (!freq)
            pCodesizes[i] = 0;
         else
         {
            total_freq += freq;
            max_freq = math::maximum(max_freq, freq);
            
            sym_freq& sf = state.syms0[num_used_syms];
            sf.m_left = (uint16)i;
            sf.m_right = cUINT16_MAX;
            sf.m_freq = freq;
            num_used_syms++;
         }            
      }
      
      total_freq_ret = total_freq;

      if (num_used_syms == 1)
      {
         pCodesizes[state.syms0[0].m_left] = 1;
         return true;
      }

      sym_freq* syms = radix_sort_syms(num_used_syms, state.syms0, state.syms1);
      
      int x[cHuffmanMaxSupportedSyms];
      for (uint i = 0; i < num_used_syms; i++)
         x[i] = syms[i].m_freq;
      
      calculate_minimum_redundancy(x, num_used_syms);
      
      uint max_len = 0;
      for (uint i = 0; i < num_used_syms; i++)
      {
         uint len = x[i];
         max_len = math::maximum(len, max_len);
         code_size_hist.m_num_codes[LZHAM_MIN(len, (uint)code_size_histogram::cMaxUnlimitedHuffCodeSize)]++;
         pCodesizes[syms[i].m_left] = static_cast<uint8>(len);
      }
      max_code_size = max_len;
                  
      return true;
   }